

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

file_status ghc::filesystem::symlink_status(path *p)

{
  uint uVar1;
  filesystem_error *this;
  uintmax_t *in_RCX;
  error_code *in_RSI;
  time_t *in_R8;
  error_code ec_00;
  error_code ec;
  uint local_50 [2];
  error_category *local_48;
  string local_40;
  
  local_50[0] = 0;
  local_48 = (error_category *)std::_V2::system_category();
  detail::symlink_status_ex(p,in_RSI,(uintmax_t *)local_50,in_RCX,in_R8);
  if (*(int *)&(p->_path)._M_dataplus._M_p != 0) {
    return (file_status)p;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  uVar1 = local_50[0];
  detail::systemErrorText<int>(&local_40,local_50[0]);
  ec_00._4_4_ = 0;
  ec_00._M_value = uVar1;
  ec_00._M_cat = local_48;
  filesystem_error::filesystem_error(this,&local_40,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE file_status symlink_status(const path& p)
{
    std::error_code ec;
    auto result = symlink_status(p, ec);
    if (result.type() == file_type::none) {
        throw filesystem_error(detail::systemErrorText(ec.value()), ec);
    }
    return result;
}